

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjectsTests.cpp
# Opt level: O1

void __thiscall
DelayedObjects_basic_Test::~DelayedObjects_basic_Test(DelayedObjects_basic_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DelayedObjects, basic)
{
    DelayedObjects<std::string> objs;

    auto fut1 = objs.getFuture("string1");
    auto fut2 = objs.getFuture(45);

    EXPECT_TRUE(objs.isRecognized("string1"));
    EXPECT_TRUE(objs.isRecognized(45));

    EXPECT_FALSE(objs.isRecognized("string2"));
    EXPECT_FALSE(objs.isRecognized(67));

    EXPECT_FALSE(objs.isCompleted("string1"));
    EXPECT_FALSE(objs.isCompleted(45));

    objs.setDelayedValue("string1", "string num1");

    auto str1 = fut1.get();
    EXPECT_EQ(str1, "string num1");

    objs.setDelayedValue(45, "string2");
    auto str2 = fut2.get();
    EXPECT_EQ(str2, "string2");

    EXPECT_TRUE(objs.isRecognized("string1"));
    EXPECT_TRUE(objs.isRecognized(45));

    EXPECT_TRUE(objs.isCompleted("string1"));
    EXPECT_TRUE(objs.isCompleted(45));

    objs.finishedWithValue("string1");

    EXPECT_FALSE(objs.isRecognized("string1"));
    EXPECT_TRUE(objs.isRecognized(45));
    objs.finishedWithValue(45);
    EXPECT_FALSE(objs.isRecognized(45));
}